

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

bool __thiscall SymbolTable::symbolExists(SymbolTable *this,Identifier *symbol,int file,int section)

{
  char *pcVar1;
  bool bVar2;
  int *piVar3;
  iterator iVar4;
  SymbolKey key;
  int local_48;
  int local_44;
  SymbolKey local_40;
  
  local_48 = section;
  local_44 = file;
  bVar2 = isValidSymbolName(symbol);
  if (bVar2) {
    pcVar1 = (symbol->_name)._M_dataplus._M_p;
    if (*pcVar1 == '@') {
      piVar3 = &local_48;
      if (pcVar1[1] == '@') {
        piVar3 = &local_44;
      }
    }
    else {
      local_48 = -1;
      piVar3 = &local_44;
    }
    *piVar3 = -1;
    SymbolKey::SymbolKey(&local_40,symbol,local_44,local_48);
    iVar4 = std::
            _Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
            ::find((_Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                    *)this,&local_40);
    bVar2 = (_Rb_tree_header *)iVar4._M_node != &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SymbolTable::symbolExists(const Identifier& symbol, int file, int section)
{
	if (!isValidSymbolName(symbol))
		return false;

	setFileSectionValues(symbol,file,section);

	SymbolKey key = { symbol, file, section };
	auto it = symbols.find(key);
	return it != symbols.end();
}